

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteTest.h
# Opt level: O0

void __thiscall oout::SuiteTest::SuiteTest<>(SuiteTest *this,shared_ptr<const_oout::Test> *test1)

{
  initializer_list<std::shared_ptr<const_oout::Test>_> __l;
  shared_ptr<const_oout::Test> *local_88;
  allocator<std::shared_ptr<const_oout::Test>_> local_51;
  shared_ptr<const_oout::Test> local_50;
  shared_ptr<const_oout::Test> local_40;
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  local_30;
  shared_ptr<const_oout::Test> *local_18;
  shared_ptr<const_oout::Test> *test1_local;
  SuiteTest *this_local;
  
  local_18 = test1;
  test1_local = (shared_ptr<const_oout::Test> *)this;
  std::shared_ptr<const_oout::Test>::shared_ptr(&local_50,test1);
  local_40.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_40.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_50;
  std::allocator<std::shared_ptr<const_oout::Test>_>::allocator(&local_51);
  __l._M_len = (size_type)
               local_40.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
  __l._M_array = (iterator)
                 local_40.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>::list
            (&local_30,__l,&local_51);
  SuiteTest(this,&local_30);
  std::__cxx11::
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>::
  ~list(&local_30);
  std::allocator<std::shared_ptr<const_oout::Test>_>::~allocator(&local_51);
  local_88 = &local_40;
  do {
    local_88 = local_88 + -1;
    std::shared_ptr<const_oout::Test>::~shared_ptr(local_88);
  } while (local_88 != &local_50);
  return;
}

Assistant:

explicit SuiteTest(
			const std::shared_ptr<const Test> &test1,
			const std::shared_ptr<T> & ... tests
		) : SuiteTest(std::list<std::shared_ptr<const Test>>{
			test1, tests...
		})
	{
	}